

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O0

TermList Inferences::piRemoval(TermList piTerm,Clause *clause,TermList expsrt)

{
  bool bVar1;
  Term *this;
  TermList *pTVar2;
  TermList in_RDX;
  TermList in_RDI;
  TermList newVar;
  uint maxVar;
  TermList in_stack_ffffffffffffffa8;
  Clause *in_stack_ffffffffffffffb0;
  Clause *in_stack_ffffffffffffffd0;
  TermList in_stack_fffffffffffffff8;
  
  Kernel::Clause::maxVar(in_stack_ffffffffffffffd0);
  do {
    Kernel::TermList::TermList
              ((TermList *)in_stack_ffffffffffffffb0,
               (uint)(in_stack_ffffffffffffffa8._content >> 0x20),
               SUB81(in_stack_ffffffffffffffa8._content >> 0x18,0));
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffd0;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffb0;
    in_RDI = ApplicativeHelper::createAppTerm(in_stack_fffffffffffffff8,in_RDI,in_RDX);
    this = Kernel::TermList::term((TermList *)0x7835d7);
    pTVar2 = Kernel::Term::nthArgument(this,1);
    in_RDX._content = pTVar2->_content;
    in_stack_ffffffffffffffa8 = Kernel::AtomicSort::boolSort();
    bVar1 = Kernel::TermList::operator!=
                      ((TermList *)&stack0xffffffffffffffe8,(TermList *)&stack0xffffffffffffffa8);
  } while (bVar1);
  return (TermList)in_RDI._content;
}

Assistant:

TermList piRemoval(TermList piTerm, Clause* clause, TermList expsrt){
  
  unsigned maxVar = clause->maxVar();
  do{ 
    maxVar++;
    TermList newVar = TermList(maxVar, false);
    piTerm = ApplicativeHelper::createAppTerm(expsrt, piTerm, newVar);
    expsrt = *expsrt.term()->nthArgument(1);
  }while(expsrt != AtomicSort::boolSort()); 
  
  return piTerm;
}